

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

DILogger * __thiscall
glcts::anon_unknown_0::DIResult::sub_result
          (DILogger *__return_storage_ptr__,DIResult *this,long _code)

{
  DILogger *pDVar1;
  DILogger *extraout_RAX;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  undefined1 local_198 [384];
  
  if (_code != 0) {
    this->status_ = this->status_ | _code;
    __return_storage_ptr__->null_log_ = false;
    pDVar1 = (DILogger *)
             std::__cxx11::ostringstream::ostringstream
                       ((ostringstream *)&__return_storage_ptr__->str_);
    return pDVar1;
  }
  local_198[0] = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
  local_198[0] = true;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__return_storage_ptr__->str_);
  __return_storage_ptr__->null_log_ = local_198[0];
  if (local_198[0] == false) {
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (&(__return_storage_ptr__->str_).super_basic_ostream<char,_std::char_traits<char>_>,
               (char *)local_1b8,local_1b0);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
  }
  DILogger::~DILogger((DILogger *)local_198);
  return extraout_RAX;
}

Assistant:

DILogger sub_result(long _code)
	{
		if (_code == NO_ERROR)
		{
			return sub_result_inner(_code).nullify();
		}
		else
		{
			return sub_result_inner(_code);
		}
	}